

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# availableprofiles.c
# Opt level: O3

int check_available(void)

{
  char *profile;
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int extraout_EAX;
  char **ppcVar5;
  ulong uVar6;
  undefined8 uStackY_50;
  char *pcStack_38;
  
  uStackY_50 = 0x1084dd;
  uVar2 = MOJOSHADER_glAvailableProfiles
                    (lookup,(void *)0x0,(char **)0x0,0,(MOJOSHADER_malloc)0x0,(MOJOSHADER_free)0x0,
                     (void *)0x0);
  ppcVar5 = &pcStack_38;
  if (0 < (int)uVar2) {
    lVar1 = -((ulong)uVar2 * 8 + 0xf & 0xfffffffffffffff0);
    *(undefined8 *)(&stack0xffffffffffffffb8 + lVar1) = 0;
    *(undefined8 *)((long)&uStackY_50 + lVar1) = 0x10851b;
    uVar2 = MOJOSHADER_glAvailableProfiles
                      (lookup,(void *)0x0,(char **)((long)&pcStack_38 + lVar1),uVar2,
                       (MOJOSHADER_malloc)0x0,(MOJOSHADER_free)0x0,
                       *(void **)(&stack0xffffffffffffffb8 + lVar1));
    ppcVar5 = (char **)((long)&pcStack_38 + lVar1);
    if (0 < (int)uVar2) {
      uVar6 = 0;
      do {
        profile = ((char **)((long)&pcStack_38 + lVar1))[uVar6];
        *(undefined8 *)(&stack0xffffffffffffffc0 + lVar1) = 0x10853c;
        uVar3 = MOJOSHADER_maxShaderModel(profile);
        *(undefined8 *)(&stack0xffffffffffffffc0 + lVar1) = 0x10854b;
        iVar4 = printf("%s (Shader Model %d)\n",profile,(ulong)uVar3);
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
      return iVar4;
    }
  }
  *(undefined8 *)((long)ppcVar5 + -8) = 0x108567;
  check_available_cold_1();
  return extraout_EAX;
}

Assistant:

static int check_available(void)
{
    const char **avail = NULL;
    int total = MOJOSHADER_glAvailableProfiles(lookup, NULL, NULL, 0, NULL, NULL, NULL);
    if (total > 0)
    {
        avail = (const char **) alloca(sizeof (const char *) * total);
        total = MOJOSHADER_glAvailableProfiles(lookup, NULL, avail, total, NULL, NULL, NULL);
    } // if

    if (total <= 0)
        fprintf(stderr, "No profiles available.\n");
    else
    {
        int i;
        for (i = 0; i < total; i++)
        {
            printf("%s (Shader Model %d)\n", avail[i],
                   MOJOSHADER_maxShaderModel(avail[i]));
        } // for
    } // else

    return 0;
}